

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  array_container_t *src;
  int i;
  uint uVar4;
  
  lVar3 = 0;
  for (uVar4 = 0; (int)uVar4 < (r->high_low_container).size; uVar4 = uVar4 + 1) {
    uVar1 = (r->high_low_container).typecodes[uVar4 & 0xffff];
    src = (array_container_t *)(r->high_low_container).containers[uVar4 & 0xffff];
    if (uVar1 == '\x04') {
      uVar1 = *(uint8_t *)&src->array;
      src = *(array_container_t **)src;
    }
    if (uVar1 == '\x01') {
      iVar2 = 0;
    }
    else if (uVar1 == '\x03') {
      iVar2 = run_container_shrink_to_fit((run_container_t *)src);
    }
    else {
      iVar2 = array_container_shrink_to_fit(src);
    }
    lVar3 = lVar3 + iVar2;
  }
  iVar2 = ra_shrink_to_fit(&r->high_low_container);
  return lVar3 + iVar2;
}

Assistant:

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r) {
    size_t answer = 0;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original;
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        answer += container_shrink_to_fit(c, type_original);
    }
    answer += ra_shrink_to_fit(&r->high_low_container);
    return answer;
}